

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t errcod;
  size_t sVar1;
  long lVar2;
  bool bVar3;
  ZSTD_inBuffer input;
  ZSTD_inBuffer local_28;
  
  local_28.src = (void *)0x0;
  local_28.size = 0;
  local_28.pos = 0;
  sVar1 = ZSTD_compressStream2(zcs,output,&local_28,ZSTD_e_end);
  if ((sVar1 < 0xffffffffffffff89) && ((zcs->appliedParams).nbWorkers < 1)) {
    bVar3 = zcs->frameEnded == 0;
    if (bVar3) {
      lVar2 = (long)(zcs->appliedParams).fParams.checksumFlag << 2;
    }
    else {
      lVar2 = 0;
    }
    sVar1 = (ulong)bVar3 * 3 + sVar1 + lVar2;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = { NULL, 0, 0 };
    size_t const remainingToFlush = ZSTD_compressStream2(zcs, output, &input, ZSTD_e_end);
    CHECK_F( remainingToFlush );
    if (zcs->appliedParams.nbWorkers > 0) return remainingToFlush;   /* minimal estimation */
    /* single thread mode : attempt to calculate remaining to flush more precisely */
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4;
        size_t const toFlush = remainingToFlush + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (unsigned)toFlush);
        return toFlush;
    }
}